

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastpackwithoutmask8_24(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  
  uVar1 = *in;
  *out = uVar1;
  uVar1 = in[1] << 8 | uVar1;
  *out = uVar1;
  uVar1 = in[2] << 0x10 | uVar1;
  *out = uVar1;
  *out = in[3] << 0x18 | uVar1;
  uVar1 = in[4];
  out[1] = uVar1;
  uVar1 = in[5] << 8 | uVar1;
  out[1] = uVar1;
  uVar1 = in[6] << 0x10 | uVar1;
  out[1] = uVar1;
  out[1] = in[7] << 0x18 | uVar1;
  uVar1 = in[8];
  out[2] = uVar1;
  uVar1 = in[9] << 8 | uVar1;
  out[2] = uVar1;
  uVar1 = in[10] << 0x10 | uVar1;
  out[2] = uVar1;
  out[2] = in[0xb] << 0x18 | uVar1;
  uVar1 = in[0xc];
  out[3] = uVar1;
  uVar1 = in[0xd] << 8 | uVar1;
  out[3] = uVar1;
  uVar1 = in[0xe] << 0x10 | uVar1;
  out[3] = uVar1;
  out[3] = in[0xf] << 0x18 | uVar1;
  uVar1 = in[0x10];
  out[4] = uVar1;
  uVar1 = in[0x11] << 8 | uVar1;
  out[4] = uVar1;
  uVar1 = in[0x12] << 0x10 | uVar1;
  out[4] = uVar1;
  out[4] = in[0x13] << 0x18 | uVar1;
  uVar1 = in[0x14];
  out[5] = uVar1;
  uVar1 = in[0x15] << 8 | uVar1;
  out[5] = uVar1;
  uVar1 = in[0x16] << 0x10 | uVar1;
  out[5] = uVar1;
  out[5] = in[0x17] << 0x18 | uVar1;
  return out + 6;
}

Assistant:

uint32_t *__fastpackwithoutmask8_24(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  ++in;

  return out;
}